

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Volume.cc
# Opt level: O2

void __thiscall Volume::simplePreVisualize(Volume *this,Mat *src,Point *obs)

{
  pointer pEVar1;
  Matrix<double,_3,_1,_0,_3,_1> *pMVar2;
  _Elt_pointer pMVar3;
  _Elt_pointer pMVar4;
  Object *obj;
  Object *this_00;
  allocator<char> local_c9;
  Point *local_c8;
  Object *local_c0;
  undefined8 local_b8;
  Point local_b0;
  char str [8];
  _InputArray local_a0;
  string local_88 [32];
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  Matx<double,_4,_1> local_58;
  
  this_00 = *(Object **)(this + 0x20);
  local_c0 = *(Object **)(this + 0x28);
  local_68 = 0;
  uStack_64 = 0;
  uStack_60 = 0;
  uStack_5c = 0x406fe000;
  local_c8 = obs;
  for (; this_00 != local_c0; this_00 = this_00 + 1) {
    local_b0 = *local_c8;
    Object::visualizeEdges(this_00,src,&local_b0);
    snprintf(str,8,"%d",(ulong)(uint)this_00->id);
    local_a0.sz.width = 0;
    local_a0.sz.height = 0;
    local_a0.flags = 0x3010000;
    local_a0.obj = src;
    std::__cxx11::string::string<std::allocator<char>>(local_88,str,&local_c9);
    pEVar1 = (this_00->edges).super__Vector_base<Edge,_std::allocator<Edge>_>._M_impl.
             super__Vector_impl_data._M_start;
    pMVar3 = ((iterator *)
             ((long)&(pEVar1->
                     super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ).
                     super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                     ._M_impl + 0x30))->_M_cur;
    if (pMVar3 == *(_Elt_pointer *)
                   ((long)&(pEVar1->
                           super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ).
                           super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                           ._M_impl + 0x38)) {
      pMVar2 = (*(_Map_pointer *)
                 ((long)&(pEVar1->
                         super_deque<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ).
                         super__Deque_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_std::allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                         ._M_impl + 0x48))[-1];
      pMVar4 = pMVar2 + 0x14;
      pMVar3 = pMVar2 + 0x15;
    }
    else {
      pMVar4 = pMVar3 + -1;
    }
    local_b8 = CONCAT44((int)*(double *)
                              ((long)&pMVar3[-1].
                                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                                      m_storage.m_data + 8) + 10,
                        (int)(pMVar4->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).
                             m_storage.m_data.array[0] + 10);
    cv::Matx<double,_4,_1>::Matx(&local_58);
    local_58.val[0] = (double)CONCAT44(uStack_64,local_68);
    local_58.val[1] = (double)CONCAT44(uStack_5c,uStack_60);
    local_58.val[2] = 255.0;
    local_58.val[3] = 0.0;
    cv::putText(0,&local_a0,local_88,&local_b8,1,&local_58,1,8,0);
    std::__cxx11::string::~string(local_88);
  }
  std::__cxx11::string::string<std::allocator<char>>(local_88,"tmp",(allocator<char> *)str);
  local_a0.sz.width = 0;
  local_a0.sz.height = 0;
  local_a0.flags = 0x1010000;
  local_a0.obj = src;
  cv::imshow(local_88,&local_a0);
  std::__cxx11::string::~string(local_88);
  cv::waitKey(0);
  return;
}

Assistant:

void Volume::simplePreVisualize(cv::Mat& src, const cv::Point& obs) const {
    for (const Object& obj: objs) {
        obj.visualizeEdges(src, obs);
        char str[8];
        snprintf(str, 8, "%d", obj.id);
		cv::putText(src, str, cv::Point(obj.edges.front().back().x(), obj.edges.front().back().y()) + cv::Point(10, 10),
				cv::FONT_HERSHEY_PLAIN, 1.5, cv::Scalar(0, 255, 255));
    }
    cv::imshow("tmp", src);
    cv::waitKey(0);
}